

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

Vec4 tcu::astc::getBlockTestTypeColorScale(BlockTestType testType)

{
  int i;
  long lVar1;
  undefined8 *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Vec4 VVar2;
  Vec4 VVar3;
  
  if (testType == BLOCK_TEST_TYPE_VOID_EXTENT_HDR) {
    lVar1 = 0;
    do {
      *(undefined4 *)((long)in_RDI + lVar1 * 4) = 0x37001002;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 4);
  }
  else {
    if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15) {
      *in_RDI = 0x3780100237801002;
      in_RDI[1] = 0x3f80000037801002;
      VVar2.m_data._8_8_ = in_XMM1_Qa;
      VVar2.m_data[0] = 1.5266243e-05;
      VVar2.m_data[1] = 1.5266243e-05;
      return (Vec4)VVar2.m_data;
    }
    lVar1 = 0;
    if (testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15) {
      do {
        *(undefined4 *)((long)in_RDI + lVar1 * 4) = 0x37801002;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
    }
    else {
      do {
        *(undefined4 *)((long)in_RDI + lVar1 * 4) = 0x3f800000;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
    }
  }
  VVar3.m_data[1] = (float)in_XMM0_Db;
  VVar3.m_data[0] = (float)in_XMM0_Da;
  VVar3.m_data._8_8_ = in_XMM1_Qa;
  return (Vec4)VVar3.m_data;
}

Assistant:

Vec4 getBlockTestTypeColorScale (BlockTestType testType)
{
	switch (testType)
	{
		case tcu::astc::BLOCK_TEST_TYPE_VOID_EXTENT_HDR:			return Vec4(0.5f/65504.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:	return Vec4(1.0f/65504.0f, 1.0f/65504.0f, 1.0f/65504.0f, 1.0f);
		case tcu::astc::BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:		return Vec4(1.0f/65504.0f);
		default:													return Vec4(1.0f);
	}
}